

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testGroupEnded(TeamCityReporter *this,TestGroupStats *testGroupStats)

{
  ostream *poVar1;
  string sStack_38;
  
  LazyStat<Catch::GroupInfo>::reset(&(this->super_StreamingReporterBase).currentGroupInfo);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           "##teamcity[testSuiteFinished name=\'");
  anon_unknown_23::escape(&sStack_38,(string *)testGroupStats);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void TeamCityReporter::testGroupEnded(TestGroupStats const &testGroupStats) {
        StreamingReporterBase::testGroupEnded(testGroupStats);
        stream << "##teamcity[testSuiteFinished name='"
            << escape(testGroupStats.groupInfo.name) << "']\n";
    }